

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_pass.h
# Opt level: O1

void __thiscall mocker::SSAConstruction::SSAConstruction(SSAConstruction *this,FunctionModule *func)

{
  (this->super_FuncPass).func = func;
  (this->super_FuncPass).super_OptPass._vptr_OptPass = (_func_int **)&PTR__SSAConstruction_001f26a0;
  (this->varNames)._M_h._M_buckets = &(this->varNames)._M_h._M_single_bucket;
  (this->varNames)._M_h._M_bucket_count = 1;
  (this->varNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->varNames)._M_h._M_element_count = 0;
  (this->varNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->varNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->varNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dominatorTree).reverse = false;
  (this->dominatorTree).dominating._M_h._M_buckets =
       &(this->dominatorTree).dominating._M_h._M_single_bucket;
  (this->dominatorTree).dominating._M_h._M_bucket_count = 1;
  (this->dominatorTree).dominating._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dominatorTree).dominating._M_h._M_element_count = 0;
  (this->dominatorTree).dominating._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dominatorTree).dominating._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dominatorTree).dominating._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dominatorTree).dominators._M_h._M_buckets =
       &(this->dominatorTree).dominators._M_h._M_single_bucket;
  (this->dominatorTree).dominators._M_h._M_bucket_count = 1;
  (this->dominatorTree).dominators._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dominatorTree).dominators._M_h._M_element_count = 0;
  (this->dominatorTree).dominators._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dominatorTree).dominators._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dominatorTree).dominators._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dominatorTree).immediateDominator._M_h._M_buckets =
       &(this->dominatorTree).immediateDominator._M_h._M_single_bucket;
  (this->dominatorTree).immediateDominator._M_h._M_bucket_count = 1;
  (this->dominatorTree).immediateDominator._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dominatorTree).immediateDominator._M_h._M_element_count = 0;
  (this->dominatorTree).immediateDominator._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dominatorTree).immediateDominator._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dominatorTree).immediateDominator._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dominatorTree).dominatorTree._M_h._M_buckets =
       &(this->dominatorTree).dominatorTree._M_h._M_single_bucket;
  (this->dominatorTree).dominatorTree._M_h._M_bucket_count = 1;
  (this->dominatorTree).dominatorTree._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dominatorTree).dominatorTree._M_h._M_element_count = 0;
  (this->dominatorTree).dominatorTree._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dominatorTree).dominatorTree._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dominatorTree).dominatorTree._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dominatorTree).dominanceFrontier._M_h._M_buckets =
       &(this->dominatorTree).dominanceFrontier._M_h._M_single_bucket;
  (this->dominatorTree).dominanceFrontier._M_h._M_bucket_count = 1;
  (this->dominatorTree).dominanceFrontier._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dominatorTree).dominanceFrontier._M_h._M_element_count = 0;
  (this->dominatorTree).dominanceFrontier._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dominatorTree).dominanceFrontier._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dominatorTree).dominanceFrontier._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->varDefined)._M_h._M_buckets = &(this->varDefined)._M_h._M_single_bucket;
  (this->varDefined)._M_h._M_bucket_count = 1;
  (this->varDefined)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->varDefined)._M_h._M_element_count = 0;
  (this->varDefined)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->varDefined)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->varDefined)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reachingDef)._M_h._M_buckets = &(this->reachingDef)._M_h._M_single_bucket;
  (this->reachingDef)._M_h._M_bucket_count = 1;
  (this->reachingDef)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reachingDef)._M_h._M_element_count = 0;
  (this->reachingDef)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reachingDef)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reachingDef)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bbDefined)._M_h._M_buckets = &(this->bbDefined)._M_h._M_single_bucket;
  (this->bbDefined)._M_h._M_bucket_count = 1;
  (this->bbDefined)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bbDefined)._M_h._M_element_count = 0;
  (this->bbDefined)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bbDefined)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bbDefined)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit FuncPass(ir::FunctionModule &func) : func(func) {}